

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar26;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  undefined1 auVar40 [16];
  int iVar45;
  int iVar46;
  undefined1 in_XMM10 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM11 [16];
  int iVar47;
  int iVar50;
  int iVar51;
  int iVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  undefined1 local_178 [16];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  undefined1 local_128 [16];
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  ulong local_a8;
  int *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined1 local_88 [16];
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_diag_sse41_128_32_cold_7();
  }
  else {
    uVar12 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sg_flags_diag_sse41_128_32_cold_6();
    }
    else if (open < 0) {
      parasail_sg_flags_diag_sse41_128_32_cold_5();
    }
    else if (gap < 0) {
      parasail_sg_flags_diag_sse41_128_32_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sg_flags_diag_sse41_128_32_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_diag_sse41_128_32_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sg_flags_diag_sse41_128_32_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        _s1Len = matrix->length;
      }
      iVar4 = _s1Len + 3;
      uVar13 = s2Len + 3;
      iVar15 = -open;
      iVar9 = matrix->min;
      uVar5 = 0x80000000 - iVar9;
      if (iVar9 != iVar15 && SBORROW4(iVar9,iVar15) == iVar9 + open < 0) {
        uVar5 = open | 0x80000000;
      }
      iVar18 = uVar5 + 1;
      iVar9 = matrix->max;
      local_138 = 0;
      iStack_134 = 0;
      iStack_130 = 0;
      iStack_12c = 0;
      if (s1_beg == 0) {
        local_98 = gap << 2;
        iStack_94 = gap << 2;
        iStack_90 = gap << 2;
        iStack_8c = gap << 2;
      }
      else {
        local_98 = 0;
        iStack_94 = 0;
        iStack_90 = 0;
        iStack_8c = 0;
      }
      local_b8._0_8_ = CONCAT44(iVar18,iVar18);
      local_b8._8_8_ = CONCAT44(iVar18,iVar18);
      local_c8._8_8_ = local_b8._8_8_;
      local_c8._0_8_ = local_b8._0_8_;
      local_d8._8_8_ = local_b8._8_8_;
      local_d8._0_8_ = local_b8._0_8_;
      local_128._8_8_ = local_b8._8_8_;
      local_128._0_8_ = local_b8._0_8_;
      local_e8._8_8_ = local_b8._8_8_;
      local_e8._0_8_ = local_b8._0_8_;
      if (s1_beg == 0) {
        iStack_130 = iVar15 - gap;
        iStack_134 = iVar15 + gap * -2;
        local_138 = -(gap * 3 + open);
        iStack_12c = iVar15;
      }
      local_48 = gap;
      iStack_44 = gap;
      iStack_40 = gap;
      iStack_3c = gap;
      ppVar7 = parasail_result_new();
      if (ppVar7 != (parasail_result_t *)0x0) {
        ppVar7->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar7->flag |
                       0x4401002;
        uVar10 = (ulong)(s2Len + 6);
        local_108 = 0x7ffffffe - iVar9;
        local_f8 = open;
        ptr = parasail_memalign_int32_t(0x10,uVar10);
        ptr_00 = parasail_memalign_int32_t(0x10,uVar10);
        ptr_01 = parasail_memalign_int32_t(0x10,uVar10);
        if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
          if (matrix->type == 0) {
            ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar4);
            if (ptr_02 == (int32_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < _s1Len) {
              piVar1 = matrix->mapper;
              uVar10 = 0;
              do {
                ptr_02[uVar10] = piVar1[(byte)_s1[uVar10]];
                uVar10 = uVar10 + 1;
              } while ((uint)_s1Len != uVar10);
            }
            iVar9 = _s1Len + 1U;
            if ((int)(_s1Len + 1U) < iVar4) {
              iVar9 = iVar4;
            }
            memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar9) * 4 + 4);
          }
          else {
            ptr_02 = (int32_t *)0x0;
          }
          local_118 = local_108;
          uStack_114 = local_108;
          uStack_110 = local_108;
          uStack_10c = local_108;
          local_68 = local_f8;
          iStack_64 = local_f8;
          iStack_60 = local_f8;
          iStack_5c = local_f8;
          local_78 = _s1Len - 1;
          iStack_74 = _s1Len - 1;
          iStack_70 = _s1Len - 1;
          iStack_6c = _s1Len - 1;
          local_108 = s2Len + -1;
          iStack_104 = s2Len + -1;
          iStack_100 = s2Len + -1;
          iStack_fc = s2Len + -1;
          piVar1 = matrix->mapper;
          uVar10 = 1;
          if (1 < s2Len) {
            uVar10 = uVar12;
          }
          uVar11 = 0;
          do {
            ptr[uVar11 + 3] = piVar1[(byte)_s2[uVar11]];
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
          ptr[2] = 0;
          ptr[0] = 0;
          ptr[1] = 0;
          uVar5 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar13) {
            uVar5 = uVar13;
          }
          local_f8 = _s1Len;
          uStack_f4 = _s1Len;
          uStack_f0 = _s1Len;
          uStack_ec = _s1Len;
          local_58 = s2Len;
          iStack_54 = s2Len;
          iStack_50 = s2Len;
          iStack_4c = s2Len;
          memset(ptr + uVar12 + 3,0,(ulong)(~s2Len + uVar5) * 4 + 4);
          uVar10 = 1;
          if (1 < s2Len) {
            uVar10 = uVar12;
          }
          uVar11 = 0;
          iVar9 = iVar15;
          if (s2_beg == 0) {
            do {
              ptr_00[uVar11 + 3] = iVar9;
              ptr_01[uVar11 + 3] = iVar18;
              uVar11 = uVar11 + 1;
              iVar9 = iVar9 - gap;
            } while (uVar10 != uVar11);
          }
          else {
            do {
              ptr_00[uVar11 + 3] = 0;
              ptr_01[uVar11 + 3] = iVar18;
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          lVar8 = 0;
          do {
            ptr_00[lVar8] = iVar18;
            ptr_01[lVar8] = iVar18;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = uVar12 + 3;
          do {
            ptr_00[lVar8] = iVar18;
            ptr_01[lVar8] = iVar18;
            lVar8 = lVar8 + 1;
            uVar5 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar5;
          } while ((int)uVar5 < (int)uVar13);
          ptr_00[2] = 0;
          local_178._0_4_ = iVar18;
          local_178._4_4_ = iVar18;
          local_178._8_4_ = iVar18;
          local_178._12_4_ = iVar18;
          local_158 = local_118;
          uStack_154 = uStack_114;
          uStack_150 = uStack_110;
          uStack_14c = uStack_10c;
          if (0 < _s1Len) {
            local_a0 = matrix->matrix;
            uVar5 = _s1Len - 1;
            auVar2._4_4_ = iVar18;
            auVar2._0_4_ = iVar18;
            auVar2._8_4_ = iVar18;
            local_178._0_12_ = auVar2;
            local_88 = local_178 >> 0x20;
            auVar22 = local_88;
            uVar12 = 1;
            if (1 < (int)uVar13) {
              uVar12 = (ulong)uVar13;
            }
            local_a8 = (ulong)(uint)_s1Len;
            auVar44 = pmovsxbd(in_XMM10,0x10203);
            uVar10 = 0;
            uVar11 = local_a8;
            do {
              iVar9 = matrix->type;
              uVar39 = (uint)uVar10;
              uVar13 = uVar39;
              if (iVar9 == 0) {
                uVar13 = ptr_02[uVar10];
              }
              if (iVar9 == 0) {
                uVar16 = ptr_02[uVar10 | 1];
              }
              else {
                uVar16 = uVar39 | 1;
                if (uVar11 <= (uVar10 | 1)) {
                  uVar16 = uVar5;
                }
              }
              if (iVar9 == 0) {
                uVar17 = ptr_02[uVar10 | 2];
              }
              else {
                uVar17 = uVar39 | 2;
                if (uVar11 <= (uVar10 | 2)) {
                  uVar17 = uVar5;
                }
              }
              if (iVar9 == 0) {
                uVar14 = ptr_02[uVar10 | 3];
              }
              else {
                uVar14 = uVar39 | 3;
                if (uVar11 <= (uVar10 | 3)) {
                  uVar14 = uVar5;
                }
              }
              iVar9 = matrix->size;
              uVar10 = uVar10 + 4;
              local_88._0_8_ = auVar2._4_8_;
              auVar53._12_4_ = ptr_00[2];
              auVar53._8_4_ = iVar18;
              auVar53._0_8_ = local_88._0_8_;
              ptr_00[2] = iVar15 - (int)uVar10 * gap;
              iVar4 = iVar15 - uVar39 * gap;
              if (s1_beg != 0) {
                iVar4 = 0;
              }
              auVar35._12_4_ = iVar4;
              auVar35._8_4_ = iVar18;
              auVar35._0_8_ = local_88._0_8_;
              iVar4 = auVar44._0_4_;
              auVar56._0_4_ = -(uint)(local_78 == iVar4);
              iVar45 = auVar44._4_4_;
              auVar56._4_4_ = -(uint)(iStack_74 == iVar45);
              iVar46 = auVar44._8_4_;
              auVar56._8_4_ = -(uint)(iStack_70 == iVar46);
              iVar6 = auVar44._12_4_;
              auVar56._12_4_ = -(uint)(iStack_6c == iVar6);
              uVar11 = 0;
              in_XMM11 = pmovsxbd(in_XMM11,0xfffefd);
              auVar38._4_4_ = iVar18;
              auVar38._0_4_ = iVar18;
              auVar38._8_4_ = iVar18;
              auVar38._12_4_ = iVar18;
              auVar49 = auVar38;
              do {
                iVar36 = auVar35._12_4_;
                auVar55._0_8_ = auVar35._4_8_;
                auVar54._0_12_ = auVar35._4_12_;
                auVar54._12_4_ = iVar36;
                auVar55._8_8_ = auVar54._8_8_ & 0xffffffff | (ulong)(uint)ptr_00[uVar11 + 3] << 0x20
                ;
                iVar26 = local_a0[(long)(int)(uVar14 * iVar9) + (long)ptr[uVar11]] + auVar53._0_4_;
                iVar30 = local_a0[(long)(int)(uVar17 * iVar9) + (long)ptr[uVar11 + 1]] +
                         auVar53._4_4_;
                iVar31 = local_a0[(long)(int)(uVar16 * iVar9) + (long)ptr[uVar11 + 2]] +
                         auVar53._8_4_;
                iVar32 = local_a0[(long)(int)(uVar13 * iVar9) + (long)ptr[uVar11 + 3]] +
                         auVar53._12_4_;
                iVar19 = auVar35._4_4_ - local_68;
                iVar23 = auVar35._8_4_ - iStack_64;
                iVar24 = iVar36 - iStack_60;
                iVar25 = ptr_00[uVar11 + 3] - iStack_5c;
                iVar47 = auVar49._4_4_ - local_48;
                iVar50 = auVar49._8_4_ - iStack_44;
                iVar51 = auVar49._12_4_ - iStack_40;
                iVar52 = ptr_01[uVar11 + 3] - iStack_3c;
                auVar48._0_4_ = (uint)(iVar47 < iVar19) * iVar19 | (uint)(iVar47 >= iVar19) * iVar47
                ;
                auVar48._4_4_ = (uint)(iVar50 < iVar23) * iVar23 | (uint)(iVar50 >= iVar23) * iVar50
                ;
                auVar48._8_4_ = (uint)(iVar51 < iVar24) * iVar24 | (uint)(iVar51 >= iVar24) * iVar51
                ;
                auVar48._12_4_ =
                     (uint)(iVar52 < iVar25) * iVar25 | (uint)(iVar52 >= iVar25) * iVar52;
                iVar19 = auVar35._0_4_ - local_68;
                iVar23 = auVar35._4_4_ - iStack_64;
                iVar24 = auVar35._8_4_ - iStack_60;
                iVar36 = iVar36 - iStack_5c;
                iVar25 = auVar38._0_4_ - local_48;
                iVar47 = auVar38._4_4_ - iStack_44;
                iVar50 = auVar38._8_4_ - iStack_40;
                iVar51 = auVar38._12_4_ - iStack_3c;
                auVar37._0_4_ = (uint)(iVar25 < iVar19) * iVar19 | (uint)(iVar25 >= iVar19) * iVar25
                ;
                auVar37._4_4_ = (uint)(iVar47 < iVar23) * iVar23 | (uint)(iVar47 >= iVar23) * iVar47
                ;
                auVar37._8_4_ = (uint)(iVar50 < iVar24) * iVar24 | (uint)(iVar50 >= iVar24) * iVar50
                ;
                auVar37._12_4_ =
                     (uint)(iVar51 < iVar36) * iVar36 | (uint)(iVar51 >= iVar36) * iVar51;
                uVar39 = ((int)auVar37._0_4_ < (int)auVar48._0_4_) * auVar48._0_4_ |
                         ((int)auVar37._0_4_ >= (int)auVar48._0_4_) * auVar37._0_4_;
                uVar41 = ((int)auVar37._4_4_ < (int)auVar48._4_4_) * auVar48._4_4_ |
                         ((int)auVar37._4_4_ >= (int)auVar48._4_4_) * auVar37._4_4_;
                uVar42 = ((int)auVar37._8_4_ < (int)auVar48._8_4_) * auVar48._8_4_ |
                         ((int)auVar37._8_4_ >= (int)auVar48._8_4_) * auVar37._8_4_;
                uVar43 = ((int)auVar37._12_4_ < (int)auVar48._12_4_) * auVar48._12_4_ |
                         ((int)auVar37._12_4_ >= (int)auVar48._12_4_) * auVar37._12_4_;
                auVar40._0_4_ =
                     (uint)((int)uVar39 < iVar26) * iVar26 | ((int)uVar39 >= iVar26) * uVar39;
                auVar40._4_4_ =
                     (uint)((int)uVar41 < iVar30) * iVar30 | ((int)uVar41 >= iVar30) * uVar41;
                auVar40._8_4_ =
                     (uint)((int)uVar42 < iVar31) * iVar31 | ((int)uVar42 >= iVar31) * uVar42;
                auVar40._12_4_ =
                     (uint)((int)uVar43 < iVar32) * iVar32 | ((int)uVar43 >= iVar32) * uVar43;
                iVar26 = in_XMM11._0_4_;
                auVar20._0_4_ = -(uint)(iVar26 == -1);
                iVar30 = in_XMM11._4_4_;
                auVar20._4_4_ = -(uint)(iVar30 == -1);
                iVar31 = in_XMM11._8_4_;
                iVar32 = in_XMM11._12_4_;
                auVar20._8_4_ = -(uint)(iVar31 == -1);
                auVar20._12_4_ = -(uint)(iVar32 == -1);
                auVar49._4_4_ = iStack_134;
                auVar49._0_4_ = local_138;
                auVar49._8_4_ = iStack_130;
                auVar49._12_4_ = iStack_12c;
                auVar35 = blendvps(auVar40,auVar49,auVar20);
                auVar3._4_4_ = iVar18;
                auVar3._0_4_ = iVar18;
                auVar3._8_4_ = iVar18;
                auVar3._12_4_ = iVar18;
                auVar49 = blendvps(auVar48,auVar3,auVar20);
                auVar38 = blendvps(auVar37,auVar3,auVar20);
                iVar19 = auVar35._0_4_;
                iVar23 = auVar35._4_4_;
                iVar25 = auVar35._12_4_;
                iVar24 = auVar35._8_4_;
                if (3 < uVar11) {
                  local_158 = (uint)(iVar19 < (int)local_158) * iVar19 |
                              (iVar19 >= (int)local_158) * local_158;
                  uStack_154 = (uint)(iVar23 < (int)uStack_154) * iVar23 |
                               (iVar23 >= (int)uStack_154) * uStack_154;
                  uStack_150 = (uint)(iVar24 < (int)uStack_150) * iVar24 |
                               (iVar24 >= (int)uStack_150) * uStack_150;
                  uStack_14c = (uint)(iVar25 < (int)uStack_14c) * iVar25 |
                               (iVar25 >= (int)uStack_14c) * uStack_14c;
                  local_178._4_4_ =
                       (uint)((int)local_178._4_4_ < iVar23) * iVar23 |
                       (uint)((int)local_178._4_4_ >= iVar23) * local_178._4_4_;
                  local_178._0_4_ =
                       (uint)((int)local_178._0_4_ < iVar19) * iVar19 |
                       (uint)((int)local_178._0_4_ >= iVar19) * local_178._0_4_;
                  local_178._8_4_ =
                       (uint)((int)local_178._8_4_ < iVar24) * iVar24 |
                       (uint)((int)local_178._8_4_ >= iVar24) * local_178._8_4_;
                  local_178._12_4_ =
                       (uint)((int)local_178._12_4_ < iVar25) * iVar25 |
                       (uint)((int)local_178._12_4_ >= iVar25) * local_178._12_4_;
                }
                auVar27._0_4_ = -(uint)(iVar4 < (int)local_f8);
                auVar27._4_4_ = -(uint)(iVar45 < (int)uStack_f4);
                auVar27._8_4_ = -(uint)(iVar46 < (int)uStack_f0);
                auVar27._12_4_ = -(uint)(iVar6 < (int)uStack_ec);
                ptr_00[uVar11] = iVar19;
                ptr_01[uVar11] = auVar49._0_4_;
                auVar33._0_4_ = -(uint)(local_108 == iVar26);
                auVar33._4_4_ = -(uint)(iStack_104 == iVar30);
                auVar33._8_4_ = -(uint)(iStack_100 == iVar31);
                auVar33._12_4_ = -(uint)(iStack_fc == iVar32);
                auVar21._0_4_ = -(uint)(iVar26 < local_58);
                auVar21._4_4_ = -(uint)(iVar30 < iStack_54);
                auVar21._8_4_ = -(uint)(iVar31 < iStack_50);
                auVar21._12_4_ = -(uint)(iVar32 < iStack_4c);
                auVar34._0_4_ = -(uint)(local_b8._0_4_ < iVar19);
                auVar34._4_4_ = -(uint)(local_b8._4_4_ < iVar23);
                auVar34._8_4_ = -(uint)(local_b8._8_4_ < iVar24);
                auVar34._12_4_ = -(uint)(local_b8._12_4_ < iVar25);
                auVar34 = ~in_XMM11 & auVar21 & auVar56 & auVar34;
                local_b8 = blendvps(local_b8,auVar40,auVar34);
                auVar28._0_4_ = -(uint)(local_c8._0_4_ < iVar19);
                auVar28._4_4_ = -(uint)(local_c8._4_4_ < iVar23);
                auVar28._8_4_ = -(uint)(local_c8._8_4_ < iVar24);
                auVar28._12_4_ = -(uint)(local_c8._12_4_ < iVar25);
                auVar28 = auVar27 & auVar33 & auVar28;
                local_c8 = blendvps(local_c8,auVar35,auVar28);
                local_d8 = blendvps(local_d8,auVar35,auVar33 & auVar56);
                local_128 = blendvps(local_128,auVar44,auVar28);
                local_e8 = blendvps(local_e8,in_XMM11,auVar34);
                in_XMM11._0_4_ = iVar26 + 1;
                in_XMM11._4_4_ = iVar30 + 1;
                in_XMM11._8_4_ = iVar31 + 1;
                in_XMM11._12_4_ = iVar32 + 1;
                uVar11 = uVar11 + 1;
                auVar53 = auVar55;
              } while (uVar12 != uVar11);
              auVar44._0_4_ = iVar4 + 4;
              auVar44._4_4_ = iVar45 + 4;
              auVar44._8_4_ = iVar46 + 4;
              auVar44._12_4_ = iVar6 + 4;
              local_138 = local_138 - local_98;
              iStack_134 = iStack_134 - iStack_94;
              iStack_130 = iStack_130 - iStack_90;
              iStack_12c = iStack_12c - iStack_8c;
              uVar11 = local_a8;
            } while (uVar10 < local_a8);
            local_88 = auVar22;
          }
          lVar8 = 0;
          iVar9 = 0;
          iVar4 = 0;
          iVar15 = iVar18;
          iVar45 = iVar18;
          iVar46 = iVar18;
          do {
            iVar6 = *(int *)(local_c8 + lVar8 * 4);
            if ((iVar45 < iVar6) || ((iVar6 == iVar45 && (*(int *)(local_128 + lVar8 * 4) < iVar9)))
               ) {
              iVar9 = *(int *)(local_128 + lVar8 * 4);
              iVar45 = iVar6;
            }
            if (iVar46 < *(int *)(local_b8 + lVar8 * 4)) {
              iVar4 = *(int *)(local_e8 + lVar8 * 4);
              iVar46 = *(int *)(local_b8 + lVar8 * 4);
            }
            if (iVar15 < *(int *)(local_d8 + lVar8 * 4)) {
              iVar15 = *(int *)(local_d8 + lVar8 * 4);
            }
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 != 4);
          if (s1_end == 0 || s2_end == 0) {
            if (s1_end == 0) {
              iVar9 = _s1Len - 1;
              iVar6 = s2Len + -1;
              if (s2_end != 0) {
                iVar6 = iVar4;
                iVar15 = iVar46;
              }
            }
            else {
              iVar6 = s2Len + -1;
              iVar15 = iVar45;
            }
          }
          else if ((iVar46 < iVar45) || (s2Len + -1 == iVar4 && iVar45 == iVar46)) {
            iVar6 = s2Len + -1;
            iVar15 = iVar45;
          }
          else {
            iVar9 = _s1Len - 1;
            iVar6 = iVar4;
            iVar15 = iVar46;
          }
          auVar22._0_4_ = -(uint)((int)local_158 < iVar18);
          auVar22._4_4_ = -(uint)((int)uStack_154 < iVar18);
          auVar22._8_4_ = -(uint)((int)uStack_150 < iVar18);
          auVar22._12_4_ = -(uint)((int)uStack_14c < iVar18);
          auVar29._0_4_ = -(uint)((int)local_118 < (int)local_178._0_4_);
          auVar29._4_4_ = -(uint)((int)uStack_114 < (int)local_178._4_4_);
          auVar29._8_4_ = -(uint)((int)uStack_110 < (int)local_178._8_4_);
          auVar29._12_4_ = -(uint)((int)uStack_10c < (int)local_178._12_4_);
          iVar4 = movmskps(iVar46,auVar29 | auVar22);
          if (iVar4 != 0) {
            *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
            iVar15 = 0;
            iVar6 = 0;
            iVar9 = 0;
          }
          ppVar7->score = iVar15;
          ppVar7->end_query = iVar9;
          ppVar7->end_ref = iVar6;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar7;
          }
          return ppVar7;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}